

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.cpp
# Opt level: O2

void __thiscall
Simulator::saveData(Simulator *this,ofstream *state_data,ofstream *control_input_data,
                   ofstream *error_data,double time_param,VectorXd *state_vec,
                   VectorXd *control_input_vec,double optimality_error)

{
  int iVar1;
  CoeffReturnType pdVar2;
  ostream *poVar3;
  int i;
  long lVar4;
  int i_1;
  
  lVar4 = 0;
  while( true ) {
    iVar1 = NMPCModel::dimState(&this->model_);
    if (iVar1 <= lVar4) break;
    pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)state_vec,
                        lVar4);
    poVar3 = std::ostream::_M_insert<double>(*pdVar2);
    std::operator<<(poVar3," ");
    lVar4 = lVar4 + 1;
  }
  std::operator<<((ostream *)state_data,"\n");
  lVar4 = 0;
  while( true ) {
    iVar1 = NMPCModel::dimControlInput(&this->model_);
    if (iVar1 <= lVar4) break;
    pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                        control_input_vec,lVar4);
    poVar3 = std::ostream::_M_insert<double>(*pdVar2);
    std::operator<<(poVar3," ");
    lVar4 = lVar4 + 1;
  }
  std::operator<<((ostream *)control_input_data,"\n");
  poVar3 = std::ostream::_M_insert<double>(optimality_error);
  std::operator<<(poVar3,"\n");
  return;
}

Assistant:

void Simulator::saveData(std::ofstream& state_data, std::ofstream& control_input_data, std::ofstream& error_data, const double time_param, const Eigen::VectorXd& state_vec, const Eigen::VectorXd& control_input_vec, const double optimality_error)
{
    for(int i=0; i<model_.dimState(); i++){
        state_data << state_vec(i) << " ";
    }
    state_data << "\n";

    for(int i=0; i<model_.dimControlInput(); i++){
        control_input_data << control_input_vec(i) << " ";
    }
    control_input_data << "\n";

    error_data << optimality_error << "\n";
}